

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O0

string * Catch::StringMaker<std::tuple<int,int,int>,void>::convert_abi_cxx11_
                   (tuple<int,_int,_int> *tuple)

{
  ReusableStringStream *in_RSI;
  string *in_RDI;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff98;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  ReusableStringStream *in_stack_ffffffffffffffe0;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffa0);
  uVar1 = 0x7b;
  ReusableStringStream::operator<<(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  ReusableStringStream::get((ReusableStringStream *)&stack0xffffffffffffffe0);
  Detail::TupleElementPrinter<std::tuple<int,_int,_int>,_0UL,_true>::print
            ((tuple<int,_int,_int> *)in_stack_ffffffffffffffe0,
             (ostream *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
  ReusableStringStream::operator<<(in_RSI,(char (*) [3])in_stack_ffffffffffffff98);
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff98);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffe0);
  return in_RDI;
}

Assistant:

static std::string convert(const std::tuple<Types...>& tuple) {
            ReusableStringStream rss;
            rss << '{';
            Detail::TupleElementPrinter<std::tuple<Types...>>::print(tuple, rss.get());
            rss << " }";
            return rss.str();
        }